

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O0

void string_in_out_testing_v2
               (string *base_path,string *problem_no,list<int,_std::allocator<int>_> *files_to_run,
               _func_void *code_to_execute)

{
  int __val;
  long lVar1;
  bool bVar2;
  reference piVar3;
  char *pcVar4;
  string *psVar5;
  ulong uVar6;
  size_type __val_00;
  ostream *this;
  duration<long,_std::ratio<1L,_1000000000L>_> local_820;
  duration<long,_std::ratio<1L,_1000000L>_> local_818;
  rep local_810;
  long micro_all;
  time_point stop_all;
  string local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  undefined1 local_6c0 [8];
  string files_count;
  type tStack_698;
  int error_count;
  duration<long,_std::ratio<1L,_1000000L>_> local_690;
  long local_688;
  long micro;
  time_point stop;
  time_point start;
  streambuf *cout_buf;
  streambuf *cin_buf;
  ofstream out_file;
  ifstream local_460 [8];
  ifstream in_no_comment_file;
  undefined1 local_250 [8];
  string in_no_comment_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  undefined1 local_170 [8];
  string exp_name;
  string out_name;
  string in_name;
  string ending;
  string f_no;
  iterator iStack_c8;
  int file_no;
  iterator __end1;
  iterator __begin1;
  list<int,_std::allocator<int>_> *__range1;
  long total_runtime;
  int local_a0;
  int total_errors;
  int file_count_failed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string path;
  time_point start_all;
  _func_void *code_to_execute_local;
  list<int,_std::allocator<int>_> *files_to_run_local;
  string *problem_no_local;
  string *base_path_local;
  
  path.field_2._8_8_ = std::chrono::_V2::system_clock::now();
  std::operator+(&local_90,base_path,"/in_out_exp_files/");
  std::operator+(&local_70,&local_90,problem_no);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_70,"/");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  bVar2 = std::__cxx11::list<int,_std::allocator<int>_>::empty(files_to_run);
  if (bVar2) {
    search_in_and_exp_files((string *)local_50,files_to_run);
  }
  local_a0 = 0;
  total_runtime._4_4_ = 0;
  __range1 = (list<int,_std::allocator<int>_> *)0x0;
  __end1 = std::__cxx11::list<int,_std::allocator<int>_>::begin(files_to_run);
  iStack_c8 = std::__cxx11::list<int,_std::allocator<int>_>::end(files_to_run);
  while (bVar2 = std::operator!=(&__end1,&stack0xffffffffffffff38), bVar2) {
    piVar3 = std::_List_iterator<int>::operator*(&__end1);
    __val = *piVar3;
    std::__cxx11::string::string((string *)(ending.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(in_name.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(out_name.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(exp_name.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_170);
    std::__cxx11::to_string(&local_190,__val);
    std::__cxx11::string::operator=
              ((string *)(ending.field_2._M_local_buf + 8),(string *)&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    pcVar4 = (char *)std::__cxx11::string::append((string *)(in_name.field_2._M_local_buf + 8));
    std::__cxx11::string::append(pcVar4);
    pcVar4 = (char *)std::__cxx11::string::append((string *)(out_name.field_2._M_local_buf + 8));
    psVar5 = (string *)std::__cxx11::string::append(pcVar4);
    std::__cxx11::string::append(psVar5);
    pcVar4 = (char *)std::__cxx11::string::append((string *)(exp_name.field_2._M_local_buf + 8));
    psVar5 = (string *)std::__cxx11::string::append(pcVar4);
    std::__cxx11::string::append(psVar5);
    pcVar4 = (char *)std::__cxx11::string::append((string *)local_170);
    psVar5 = (string *)std::__cxx11::string::append(pcVar4);
    std::__cxx11::string::append(psVar5);
    std::operator+(&local_210,"\n",problem_no);
    std::operator+(&local_1f0,&local_210,", file-nr ");
    std::__cxx11::to_string((string *)((long)&in_no_comment_name.field_2 + 8),__val);
    std::operator+(&local_1d0,&local_1f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&in_no_comment_name.field_2 + 8));
    std::operator+(&local_1b0,&local_1d0,"...  ");
    write_colored_text(&local_1b0,blue);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)(in_no_comment_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    create_file_with_removed_comments((string *)local_250,(string *)((long)&out_name.field_2 + 8));
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::ifstream::ifstream(local_460,local_250,8);
      bVar2 = problem_with_file_to_read(local_460,(string *)local_250);
      if (bVar2) {
        bVar2 = true;
      }
      else {
        std::ofstream::ofstream(&cin_buf,(undefined1 *)((long)&exp_name.field_2 + 8),0x10);
        bVar2 = problem_with_file_to_write
                          ((ofstream *)&cin_buf,(string *)((long)&exp_name.field_2 + 8));
        if (bVar2) {
          bVar2 = true;
        }
        else {
          lVar1 = *(long *)(std::cin + -0x18);
          std::ifstream::rdbuf();
          std::ios::rdbuf((streambuf *)((long)&std::cin + lVar1));
          lVar1 = *(long *)(std::cout + -0x18);
          std::ofstream::rdbuf();
          std::ios::rdbuf((streambuf *)((long)&std::cout + lVar1));
          stop.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          (*code_to_execute)();
          micro = std::chrono::_V2::system_clock::now();
          std::ios::rdbuf((streambuf *)((long)&std::cin + *(long *)(std::cin + -0x18)));
          std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
          tStack_698 = std::chrono::operator-
                                 ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                   *)&micro,&stop);
          local_690.__r =
               (rep)std::chrono::
                    duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                              (&stack0xfffffffffffff968);
          local_688 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_690);
          std::operator<<((ostream *)&std::cout,"code: ");
          print_time(local_688);
          std::operator<<((ostream *)&std::cout,"...  ");
          __range1 = (list<int,_std::allocator<int>_> *)
                     ((long)&(__range1->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node
                             .super__List_node_base._M_next + local_688);
          std::ofstream::close();
          std::ifstream::close();
          remove_a_file((string *)local_250);
          files_count.field_2._12_4_ =
               execute_tests((string *)((long)&exp_name.field_2 + 8),(string *)local_170);
          if (files_count.field_2._12_4_ == -9999) {
            bVar2 = true;
          }
          else {
            if (0 < (int)files_count.field_2._12_4_) {
              local_a0 = local_a0 + 1;
              total_runtime._4_4_ = files_count.field_2._12_4_ + total_runtime._4_4_;
            }
            bVar2 = false;
          }
        }
        std::ofstream::~ofstream(&cin_buf);
      }
      std::ifstream::~ifstream(local_460);
    }
    else {
      bVar2 = true;
    }
    std::__cxx11::string::~string((string *)local_250);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)(exp_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(out_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(in_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(ending.field_2._M_local_buf + 8));
    if (bVar2) goto LAB_00109a34;
    std::_List_iterator<int>::operator++(&__end1);
  }
  __val_00 = std::__cxx11::list<int,_std::allocator<int>_>::size(files_to_run);
  std::__cxx11::to_string((string *)local_6c0,__val_00);
  if (local_a0 == 0) {
    std::operator+(&local_700,"\n-> Hurray, all ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c0);
    std::operator+(&local_6e0,&local_700," provided tests passed!");
    write_colored_text(&local_6e0,cyan);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::__cxx11::string::~string((string *)&local_700);
  }
  else {
    std::__cxx11::to_string(&local_7e0,local_a0);
    std::operator+(&local_7c0,"\n-> ",&local_7e0);
    std::operator+(&local_7a0,&local_7c0," of ");
    std::operator+(&local_780,&local_7a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c0);
    std::operator+(&local_760,&local_780," provided tests failed with a total of ");
    std::__cxx11::to_string((string *)&stop_all,total_runtime._4_4_);
    std::operator+(&local_740,&local_760,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stop_all);
    std::operator+(&local_720,&local_740," wrong lines.");
    write_colored_text(&local_720,red);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::~string((string *)&local_740);
    std::__cxx11::string::~string((string *)&stop_all);
    std::__cxx11::string::~string((string *)&local_760);
    std::__cxx11::string::~string((string *)&local_780);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::__cxx11::string::~string((string *)&local_7e0);
  }
  std::operator<<((ostream *)&std::cout,"  Total code execution: ");
  print_time((long)__range1);
  std::operator<<((ostream *)&std::cout,", total overall time: ");
  micro_all = std::chrono::_V2::system_clock::now();
  local_820.__r =
       (rep)std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&micro_all,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)((long)&path.field_2 + 8));
  local_818.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                      (&local_820);
  local_810 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_818);
  print_time(local_810);
  this = std::operator<<((ostream *)&std::cout,".");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_6c0);
LAB_00109a34:
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void string_in_out_testing_v2(const string &base_path,
                              const string &problem_no,
                              list<int> &files_to_run,
                              void (*code_to_execute)()) {

    auto start_all = chrono::high_resolution_clock::now();

    string path = base_path + "/in_out_exp_files/" + problem_no + "/";

    // If no files were provided, then search the directory for in1.txt, in2.txt  and exp1.txt, exp2.txt and so on:
    if (files_to_run.empty()) search_in_and_exp_files(path, files_to_run);


    int file_count_failed = 0;
    int total_errors = 0;
    long int total_runtime = 0;

    for (int file_no : files_to_run) {
        // Note: Simple string concatenation would work:
//        path = path + problem_no + "/";
        // But since this concatenation is now inside a loop, CLion suggests:
        //     Clang-Tidy: String concatenation results in_file allocation of unnecessary temporary strings; consider 
        //     using 'operator+=' or 'string::append()' instead
        // See also https://www.w3schools.com/cpp/cpp_strings_concat.asp for a short explanation
        // NOTE: Strings are automatically initialized to "".
        string f_no, ending, in_name, out_name, exp_name;
        f_no = to_string(file_no);
        ending.append(f_no).append(".txt");
        in_name.append(path).append("in").append(ending);
        out_name.append(path).append("out").append(ending);
        exp_name.append(path).append("exp").append(ending);

        write_colored_text("\n" + problem_no + ", file-nr " + to_string(file_no) + "...  ", blue);

        // Creating file with removed comments in in_file:
        string in_no_comment_name = create_file_with_removed_comments(in_name);
        if (in_no_comment_name.empty()) return;

        // Open the files:
        ifstream in_no_comment_file(in_no_comment_name);
        if (problem_with_file_to_read(in_no_comment_file, in_no_comment_name)) return;
        ofstream out_file(out_name);
        if (problem_with_file_to_write(out_file, out_name)) return;


        // Switching cin (stdin) to read from file in_name and switching cout (stdout) to write to file out_name:
        streambuf *cin_buf = cin.rdbuf(in_no_comment_file.rdbuf()); // Save old buf and redirect cin to in_file.txt
        streambuf *cout_buf = cout.rdbuf(out_file.rdbuf()); // Save old buf and redirect cout to out_file.txt

        // Start the code timer:
        auto start = chrono::high_resolution_clock::now();

        // Execute passed in_file code (now using the changed cin and cout):
        code_to_execute();

        // Stop the timer:
        auto stop = chrono::high_resolution_clock::now();

        // Recreate the standard output to the terminal:
        cin.rdbuf(cin_buf);   // Reset to standard input again
        cout.rdbuf(cout_buf); // Reset to standard output again

        // Subtract stop and start time-points and cast it to required unit with duration_cast() function: 
        // Predefined units are: nanoseconds, microseconds, milliseconds, seconds, minutes, hours.
        long int micro = chrono::duration_cast<chrono::microseconds>(stop - start).count();
        cout << "code: ";
        print_time(micro);
        cout << "...  ";
        total_runtime += micro;
        // Close out_file (was open for write access - but in the tests, its needed for read-access)
        out_file.close();

        // Remove the file without comments
        in_no_comment_file.close();
        remove_a_file(in_no_comment_name);


        // Execute the tests:
        int error_count = execute_tests(out_name, exp_name);
        if (error_count == -9999) return; // abort if error in execute_tests(..) occurred
        else if (error_count > 0) {
            file_count_failed++;
            total_errors += error_count;
        }
    }

    string files_count = to_string(files_to_run.size());

    if (file_count_failed == 0) {
        write_colored_text("\n-> Hurray, all " + files_count + " provided tests passed!", cyan);
    } else {
        write_colored_text(
                "\n-> " + to_string(file_count_failed) + " of " + files_count +
                " provided tests failed with a total of " + to_string(total_errors) + " wrong lines.", red);
    }
    cout << "  Total code execution: ";
    print_time(total_runtime);
    cout << ", total overall time: ";
    auto stop_all = chrono::high_resolution_clock::now();
    long int micro_all = chrono::duration_cast<chrono::microseconds>(stop_all - start_all).count();
    print_time(micro_all);
    cout << "." << endl;

}